

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::TimeStamp::Encode(TimeStamp *this,KDataStream *stream)

{
  TimeStamp *self;
  KDataStream *stream_local;
  TimeStamp *this_local;
  
  if ((this->m_bAutoCalcRel & 1U) != 0) {
    CalculateTimeStamp(this);
  }
  KDataStream::operator<<(stream,(this->m_TimeStampUnion).m_ui32TimeStamp);
  return;
}

Assistant:

void TimeStamp::Encode( KDataStream & stream ) const
{
    // Do we need to calculate the timestamp first?
    if( m_bAutoCalcRel )
    {
        // We need to cast away the const so we can make the change.
        TimeStamp * self = const_cast<TimeStamp*>( this );
        self->CalculateTimeStamp();
    }

    stream << m_TimeStampUnion.m_ui32TimeStamp;
}